

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_graph.h
# Opt level: O3

void __thiscall PP_point::~PP_point(PP_point *this)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pPVar3;
  
  this->_vptr_PP_point = (_func_int **)&PTR__PP_point_00115c18;
  pPVar1 = (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar2 = (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar3 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      (**pPVar3->_vptr_PP_edge)(pPVar3);
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2);
    (this->e).super__Vector_base<PP_edge,_std::allocator<PP_edge>_>._M_impl.super__Vector_impl_data.
    _M_finish = pPVar1;
  }
  std::vector<PP_edge,_std::allocator<PP_edge>_>::~vector(&this->e);
  return;
}

Assistant:

virtual ~PP_point()
    {
        e.clear();
    }